

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::bootstrap(RpcConnectionState *this)

{
  uint *puVar1;
  uint uVar2;
  long *plVar3;
  undefined8 *puVar4;
  SourceLocation location;
  QuestionRef *pQVar5;
  Disposer *node;
  PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  *pPVar6;
  char *pcVar7;
  size_t sVar8;
  Refcounted *refcounted_1;
  Question *pQVar9;
  RpcPipeline *this_00;
  Refcounted *refcounted;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *extraout_RDX_02;
  ClientHook *extraout_RDX_03;
  ClientHook *pCVar10;
  RpcConnectionState *in_RSI;
  Refcounted *refcounted_3;
  RpcPipeline *ptrCopy;
  Own<capnp::ClientHook,_std::nullptr_t> OVar11;
  ArrayPtr<const_capnp::PipelineOp> ops;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> message;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> questionRef;
  PromiseFulfillerPair<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  paf;
  QuestionId questionId;
  Builder builder;
  undefined8 *local_270;
  long *local_268;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> local_260;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> local_250;
  PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  *pPStackY_240;
  QuestionId local_234;
  SegmentBuilder *in_stack_fffffffffffffdd0;
  SegmentBuilder *node_00;
  SegmentBuilder *pSVar12;
  CapTableBuilder *in_stack_fffffffffffffdd8;
  undefined2 *in_stack_fffffffffffffde0;
  SegmentBuilder *local_1f0;
  CapTableBuilder *pCStack_1e8;
  WirePointer *local_1e0;
  PointerBuilder local_1d8;
  Exception local_1b8;
  
  uVar2 = (in_RSI->connection).tag;
  if (uVar2 == 2) {
    kj::Exception::Exception(&local_1b8,(Exception *)&(in_RSI->connection).field_1);
    newBrokenCap((capnp *)this,&local_1b8);
    kj::Exception::~Exception(&local_1b8);
    pCVar10 = extraout_RDX;
  }
  else {
    if ((in_RSI->idle == true) && (in_RSI->idle = false, uVar2 == 1)) {
      plVar3 = *(long **)((long)&(in_RSI->connection).field_1 + 0x10);
      (**(code **)(*plVar3 + 0x28))(plVar3,0);
    }
    pQVar9 = anon_unknown_18::
             ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::next
                       (&in_RSI->questions,&local_234);
    pQVar9->isAwaitingReturn = true;
    location.function = (char *)in_stack_fffffffffffffdd8;
    location.fileName = (char *)in_stack_fffffffffffffdd0;
    location._16_8_ = in_stack_fffffffffffffde0;
    kj::
    newPromiseAndFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>
              (location);
    local_260.disposer = (Disposer *)operator_new(0x38);
    pPVar6 = pPStackY_240;
    pPStackY_240 = (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
                    *)0x0;
    (((QuestionRef *)local_260.disposer)->super_Refcounted).refcount = 0;
    (((QuestionRef *)local_260.disposer)->super_Refcounted).super_Disposer._vptr_Disposer =
         (_func_int **)&PTR_disposeImpl_006f9b48;
    puVar1 = &(in_RSI->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    (((QuestionRef *)local_260.disposer)->connectionState).ptr.disposer =
         &(in_RSI->super_Refcounted).super_Disposer;
    (((QuestionRef *)local_260.disposer)->connectionState).ptr.ptr = in_RSI;
    ((QuestionRef *)local_260.disposer)->id = local_234;
    (((QuestionRef *)local_260.disposer)->fulfiller).ptr.disposer = (Disposer *)local_250.ptr;
    (((QuestionRef *)local_260.disposer)->fulfiller).ptr.ptr = pPVar6;
    (((QuestionRef *)local_260.disposer)->super_Refcounted).refcount = 1;
    (pQVar9->selfRef).ptr = (QuestionRef *)local_260.disposer;
    (((QuestionRef *)local_260.disposer)->super_Refcounted).refcount = 2;
    local_260.ptr = (QuestionRef *)local_260.disposer;
    local_1b8.ownFile.content.ptr = (char *)local_260.disposer;
    local_1b8.ownFile.content.size_ = (size_t)local_260.disposer;
    kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>
    ::attach<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
              ((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>
                *)&stack0xfffffffffffffdd0,&local_250);
    node_00 = (SegmentBuilder *)0x0;
    if ((PromiseArenaMember *)local_250.disposer != (PromiseArenaMember *)0x0) {
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)local_250.disposer);
      local_250.disposer = (Disposer *)in_stack_fffffffffffffdd0;
      in_stack_fffffffffffffdd0 = (SegmentBuilder *)local_250.disposer;
    }
    local_250.disposer = (Disposer *)in_stack_fffffffffffffdd0;
    pSVar12 = node_00;
    if (node_00 != (SegmentBuilder *)0x0) {
      pSVar12 = (SegmentBuilder *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00);
    }
    sVar8 = local_1b8.ownFile.content.size_;
    if ((QuestionRef *)local_1b8.ownFile.content.size_ != (QuestionRef *)0x0) {
      local_1b8.ownFile.content.size_ = 0;
      (**(((Refcounted *)local_1b8.ownFile.content.ptr)->super_Disposer)._vptr_Disposer)
                (local_1b8.ownFile.content.ptr,
                 (((Refcounted *)sVar8)->super_Disposer)._vptr_Disposer[-2] +
                 (long)&(((Refcounted *)sVar8)->super_Disposer)._vptr_Disposer);
    }
    puVar4 = *(undefined8 **)((long)&(in_RSI->connection).field_1 + 0x10);
    (**(code **)*puVar4)(&local_270,puVar4,5);
    (**(code **)*local_268)(&local_1f0);
    local_1d8.pointer = local_1e0;
    local_1d8.segment = local_1f0;
    local_1d8.capTable = pCStack_1e8;
    PointerBuilder::initStruct
              ((StructBuilder *)&stack0xfffffffffffffdd0,&local_1d8,(StructSize)0x10001);
    *in_stack_fffffffffffffde0 = 8;
    local_1d8.segment = pSVar12;
    PointerBuilder::initStruct((StructBuilder *)&local_1b8,&local_1d8,(StructSize)0x10001);
    *(QuestionId *)&(local_1b8.ownFile.content.disposer)->_vptr_ArrayDisposer = local_234;
    (**(code **)(*local_268 + 0x10))();
    plVar3 = local_268;
    if (local_268 != (long *)0x0) {
      local_268 = (long *)0x0;
      (**(code **)*local_270)(local_270,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    this_00 = (RpcPipeline *)operator_new(0x228);
    RpcPipeline::RpcPipeline
              (this_00,in_RSI,&local_260,
               (Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                *)&local_250);
    puVar1 = &(this_00->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    local_1b8.ownFile.content.ptr = (char *)0x0;
    local_1b8.ownFile.content.size_ = 0;
    local_1b8.ownFile.content.disposer = (ArrayDisposer *)0x0;
    ops.size_ = 0;
    ops.ptr = (PipelineOp *)this_00;
    RpcPipeline::getPipelinedCap((RpcPipeline *)this,ops);
    sVar8 = local_1b8.ownFile.content.size_;
    pcVar7 = local_1b8.ownFile.content.ptr;
    if (local_1b8.ownFile.content.ptr != (char *)0x0) {
      local_1b8.ownFile.content.ptr = (char *)0x0;
      local_1b8.ownFile.content.size_ = 0;
      (**(local_1b8.ownFile.content.disposer)->_vptr_ArrayDisposer)
                (local_1b8.ownFile.content.disposer,pcVar7,8,sVar8,sVar8,0);
    }
    (**(this_00->super_Refcounted).super_Disposer._vptr_Disposer)
              (&this_00->super_Refcounted,
               (this_00->super_PipelineHook)._vptr_PipelineHook[-2] +
               (long)&(this_00->super_PipelineHook)._vptr_PipelineHook);
    pQVar5 = local_260.ptr;
    pCVar10 = extraout_RDX_00;
    if (local_260.ptr != (QuestionRef *)0x0) {
      local_260.ptr = (QuestionRef *)0x0;
      (**(((Refcounted *)&(local_260.disposer)->_vptr_Disposer)->super_Disposer)._vptr_Disposer)
                (local_260.disposer,
                 (pQVar5->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                 (long)&(pQVar5->super_Refcounted).super_Disposer._vptr_Disposer);
      pCVar10 = extraout_RDX_01;
    }
    pPVar6 = pPStackY_240;
    if (pPStackY_240 !=
        (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
         *)0x0) {
      pPStackY_240 = (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
                      *)0x0;
      (**((local_250.ptr)->super_Refcounted).super_Disposer._vptr_Disposer)
                (local_250.ptr,(long)pPVar6 + *(long *)(*(long *)pPVar6 + -0x10));
      pCVar10 = extraout_RDX_02;
    }
    node = local_250.disposer;
    if ((SegmentBuilder *)local_250.disposer != (SegmentBuilder *)0x0) {
      local_250.disposer = (Disposer *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
      pCVar10 = extraout_RDX_03;
    }
  }
  OVar11.ptr = pCVar10;
  OVar11.disposer = (Disposer *)this;
  return OVar11;
}

Assistant:

kj::Own<ClientHook> bootstrap() {
    if (connection.is<Disconnected>()) {
      return newBrokenCap(kj::cp(connection.get<Disconnected>()));
    }

    setNotIdle();

    QuestionId questionId;
    auto& question = questions.next(questionId);

    question.isAwaitingReturn = true;

    auto paf = kj::newPromiseAndFulfiller<kj::Promise<kj::Own<RpcResponse>>>();

    auto questionRef = kj::refcounted<QuestionRef>(*this, questionId, kj::mv(paf.fulfiller));
    question.selfRef = *questionRef;

    paf.promise = paf.promise.attach(kj::addRef(*questionRef));

    {
      auto message = connection.get<Connected>().connection->newOutgoingMessage(
          messageSizeHint<rpc::Bootstrap>());

      auto builder = message->getBody().initAs<rpc::Message>().initBootstrap();
      builder.setQuestionId(questionId);
      message->send();
    }

    auto pipeline = kj::refcounted<RpcPipeline>(*this, kj::mv(questionRef), kj::mv(paf.promise));

    return pipeline->getPipelinedCap(kj::Array<const PipelineOp>(nullptr));
  }